

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O3

void uts_parseParams(int argc,char **argv)

{
  int iVar1;
  tree_t tVar2;
  size_t sVar3;
  char *pcVar4;
  char *__s;
  ulong uVar5;
  ulong uVar6;
  
  if (1 < argc) {
    uVar5 = 2;
    do {
      __s = argv[uVar5 - 1];
      if (*__s != '-') goto switchD_00102eb9_caseD_63;
      if (__s[1] == 'h') {
        uts_helpMessage();
        impl_abort(0);
        __s = argv[uVar5 - 1];
      }
      else {
        sVar3 = strlen(__s);
        if ((sVar3 != 2) || ((uint)argc <= uVar5)) goto switchD_00102eb9_caseD_63;
      }
      iVar1 = impl_parseParam(__s,argv[uVar5]);
      if (iVar1 == 0) goto LAB_00102f93;
      __s = argv[uVar5 - 1];
      switch(__s[1]) {
      case 'a':
        tVar2 = atoi(argv[uVar5]);
        shape_fn = tVar2;
        goto LAB_00102f37;
      case 'b':
        b_0 = atof(argv[uVar5]);
        break;
      default:
        goto switchD_00102eb9_caseD_63;
      case 'd':
        gen_mx = atoi(argv[uVar5]);
        break;
      case 'f':
        shiftDepth = atof(argv[uVar5]);
        break;
      case 'g':
        computeGranularity = atoi(argv[uVar5]);
        if (computeGranularity < 2) {
          computeGranularity = 1;
        }
        break;
      case 'm':
        nonLeafBF = atoi(argv[uVar5]);
        break;
      case 'q':
        nonLeafProb = atof(argv[uVar5]);
        break;
      case 'r':
        rootId = atoi(argv[uVar5]);
        break;
      case 't':
        tVar2 = atoi(argv[uVar5]);
        type = tVar2;
LAB_00102f37:
        if (BALANCED < tVar2) {
switchD_00102eb9_caseD_63:
          if ((int)uVar5 < argc) {
            pcVar4 = argv[(int)uVar5];
          }
          else {
            pcVar4 = "[none]";
          }
          printf("Unrecognized parameter or incorrect/missing value: \'%s %s\'\n",__s,pcVar4);
          puts("Try -h for help.");
          impl_abort(4);
          return;
        }
        break;
      case 'v':
        verbose = atoi(argv[uVar5]);
        break;
      case 'x':
        debug = atoi(argv[uVar5]);
      }
LAB_00102f93:
      uVar6 = uVar5 + 1;
      uVar5 = uVar5 + 2;
    } while (uVar6 < (uint)argc);
  }
  return;
}

Assistant:

void uts_parseParams(int argc, char *argv[]){
  int i = 1; 
  int err = -1;
  while (i < argc && err == -1) {
    if (argv[i][0] == '-' && argv[i][1] == 'h') {
        uts_helpMessage();
        impl_abort(0);

    } else if (argv[i][0] != '-' || strlen(argv[i]) != 2 || argc <= i+1) {
      err = i; break;
    }

    // Matched by implementation -- return 0 on success
    // This is fragile, don't override parameters in impl_parseParam()!
    if (!impl_parseParam(argv[i], argv[i+1])) {
      i += 2;
      continue;
    }

    switch (argv[i][1]) {
      case 'q':
        nonLeafProb = atof(argv[i+1]); break;
      case 'm':
        nonLeafBF = atoi(argv[i+1]); break;
      case 'r':
        rootId = atoi(argv[i+1]); break;
      case 'x':
        debug = atoi(argv[i+1]); break;
      case 'v':
        verbose = atoi(argv[i+1]); break;
      case 't':
        type = (tree_t) atoi(argv[i+1]); 
        if (type != BIN && type != GEO && type!= HYBRID && type != BALANCED) 
	  err = i;
        break;
      case 'a':
        shape_fn = (geoshape_t) atoi(argv[i+1]);
        if (shape_fn > FIXED) err = i;
        break;
      case 'b':
        b_0 = atof(argv[i+1]); break;
      case 'd':
        gen_mx = atoi(argv[i+1]); break;
      case 'f':
        shiftDepth = atof(argv[i+1]); break;
      case 'g':
        computeGranularity = max(1,atoi(argv[i+1])); break;
      default:
        err = i;
    }

    if (err != -1) break;

    i += 2;
  }

  if (err != -1) {
    printf("Unrecognized parameter or incorrect/missing value: '%s %s'\n", argv[i], (i+1 < argc) ? argv[i+1] : "[none]");
    printf("Try -h for help.\n");
    impl_abort(4);
  }
}